

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spear.cpp
# Opt level: O2

void __thiscall Spear::Spear(Spear *this,string *n,int t,int spT)

{
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&sStack_88,(string *)n);
  std::operator+(&local_68,"Green Card - Item. Spear: ",n);
  Item::Item(&this->super_Item,&sStack_88,t,spT,0,0,2,1,1,2,3,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_88);
  (this->super_Item).super_GreenCard.super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001164c8
  ;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 0;
  this->tapped = false;
  this->attackBonus = 0;
  this->defenseBonus = 2;
  this->minimumHonor = 1;
  std::operator+(&local_48,"Green Card - Item. Spear: ",&this->name);
  std::__cxx11::string::operator=((string *)&this->cardText,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->effectBonus = 1;
  this->effectCost = 2;
  this->durability = 3;
  return;
}

Assistant:

Spear::Spear(string n, int t, int spT) : Item{n, t, spT, 0, 0, 2, 1, 1, 2, 3, "Green Card - Item. Spear: " + n}
{
    name = n;
    cost = 0;
    tapped = false;

    attackBonus = 0;
    defenseBonus = 2;
    minimumHonor = 1;
    cardText = "Green Card - Item. Spear: " + name;

    effectBonus = 1;
    effectCost = 2;
    durability = 3;
}